

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::v_formatter<spdlog::details::scoped_padder>::format
          (v_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  char *begin;
  scoped_padder p;
  scoped_padder sStack_38;
  
  scoped_padder::scoped_padder
            (&sStack_38,(msg->payload).size_,&(this->super_flag_formatter).padinfo_,dest);
  begin = (msg->payload).data_;
  fmt::v6::internal::buffer<char>::append<char>
            (&dest->super_buffer<char>,begin,begin + (msg->payload).size_);
  scoped_padder::~scoped_padder(&sStack_38);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        ScopedPadder p(msg.payload.size(), padinfo_, dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }